

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction_X86.cpp
# Opt level: O3

int __thiscall
x86Instruction::Decode(x86Instruction *this,CodeGenRegVmStateContext *ctx,char *buf,uint bufSize)

{
  x86Argument *this_00;
  x86Command xVar1;
  ArgType AVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  bool bVar6;
  ulong uVar7;
  char *pcVar8;
  char *pcVar9;
  bool useMmWord;
  
  pcVar8 = buf;
  if (ctx->vsAsmStyle == true) {
    pcVar8 = buf + 1;
    *buf = ' ';
  }
  xVar1 = this->name;
  if ((ulong)xVar1 == 0x49) {
    builtin_strncpy(pcVar8,"  ; ",5);
    sVar4 = strlen(pcVar8);
    pcVar8 = pcVar8 + sVar4;
    strcpy(pcVar8,(this->field_4).comment);
    sVar4 = strlen(pcVar8);
    pcVar9 = pcVar8 + sVar4;
  }
  else if (xVar1 == o_label) {
    iVar3 = NULLC::SafeSprintf(pcVar8,(ulong)(((int)buf - (int)pcVar8) + bufSize),"0x%p:",
                               (ulong)(this->field_4).labelID);
    pcVar9 = pcVar8 + iVar3;
  }
  else {
    strcpy(pcVar8,*(char **)((anonymous_namespace)::x86CmdText + (ulong)xVar1 * 8));
    sVar4 = strlen(pcVar8);
    pcVar9 = pcVar8 + sVar4;
    if (ctx->vsAsmStyle == true) {
      sVar5 = strlen(*(char **)((anonymous_namespace)::x86CmdText + (ulong)this->name * 8));
      if ((uint)sVar5 < 0xb) {
        uVar7 = (ulong)(10 - (uint)sVar5);
        memset(pcVar9,0x20,uVar7 + 1);
        pcVar9 = pcVar8 + sVar4 + uVar7 + 1;
      }
    }
  }
  if (this->name != o_none) {
    this_00 = &this->argA;
    if ((this->argA).type != argNone) {
      *pcVar9 = ' ';
      xVar1 = this->name;
      AVar2 = (this->argB).type;
      bVar6 = true;
      if ((((1 < xVar1 - o_push) && (xVar1 != o_call)) && ((int)xVar1 < 0x4d)) &&
         ((xVar1 != o_movsxd && ((this->argA).type != argPtr)))) {
        bVar6 = xVar1 != o_cvttsd2si && ((this->argB).field_1.reg == rEDX && AVar2 == argPtr);
      }
      iVar3 = x86Argument::Decode(this_00,ctx,pcVar9 + 1,bufSize,bVar6,
                                  (bool)(AVar2 == argXmmReg & ctx->vsAsmStyle),xVar1 == o_lea);
      pcVar9 = pcVar9 + 1 + iVar3;
    }
    if ((this->argB).type != argNone) {
      *pcVar9 = ',';
      if (ctx->vsAsmStyle == false) {
        pcVar9[1] = ' ';
        pcVar9 = pcVar9 + 2;
      }
      else {
        pcVar9 = pcVar9 + 1;
      }
      xVar1 = this->name;
      bVar6 = true;
      if (((xVar1 != o_movsxd) && ((int)xVar1 < 0x4d)) && ((this->argB).type != argPtr)) {
        if (this_00->type == argPtr) {
          bVar6 = (this->argA).field_1.reg == rEDX;
        }
        else {
          bVar6 = false;
        }
      }
      if (ctx->vsAsmStyle == true) {
        useMmWord = true;
        if (this_00->type != argXmmReg) {
          useMmWord = (xVar1 - o_cvttsd2si & 0xffffffdf) == 0;
        }
      }
      else {
        useMmWord = false;
      }
      iVar3 = x86Argument::Decode(&this->argB,ctx,pcVar9,bufSize,bVar6,useMmWord,xVar1 == o_lea);
      pcVar9 = pcVar9 + iVar3;
    }
  }
  if (ctx->vsAsmStyle == true) {
    pcVar9[0] = ' ';
    pcVar9[1] = ' ';
    pcVar9[2] = '\0';
    pcVar9 = pcVar9 + 2;
  }
  if (pcVar9 < buf + bufSize) {
    __assert_fail("buf + bufSize <= curr",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Instruction_X86.cpp"
                  ,0x115,
                  "int x86Instruction::Decode(CodeGenRegVmStateContext &, char *, unsigned int)");
  }
  return (int)pcVar9 - (int)buf;
}

Assistant:

int	x86Instruction::Decode(CodeGenRegVmStateContext &ctx, char *buf, unsigned bufSize)
{
	char *curr = buf;

	if(ctx.vsAsmStyle)
		*curr++ = ' ';

	if(name == o_label)
	{
		curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "0x%p:", (void*)(intptr_t)labelID);
	}
	else if(name == o_other)
	{
		strcpy(curr, "  ; ");
		curr += strlen(curr);

		strcpy(curr, comment);
		curr += strlen(curr);
	}
	else
	{
		strcpy(curr, x86CmdText[name]);
		curr += strlen(curr);

		if(ctx.vsAsmStyle)
		{
			for(unsigned width = (unsigned)strlen(x86CmdText[name]); width < 11; width++)
				*curr++ = ' ';
		}
	}

	if(name != o_none)
	{
		if(argA.type != x86Argument::argNone)
		{
			*curr++ = ' ';

			bool usex64 = name >= o_mov64 || name == o_movsxd || ((argA.type == x86Argument::argPtr || name == o_call || name == o_push || name == o_pop) && sizeof(void*) == 8) || (argB.type == x86Argument::argPtr && argB.ptrSize == sQWORD && name != o_cvttsd2si);
			bool useMmWord = ctx.vsAsmStyle && argB.type == x86Argument::argXmmReg;

			curr += argA.Decode(ctx, curr, bufSize, usex64, useMmWord, name == o_lea);
		}
		if(argB.type != x86Argument::argNone)
		{
			*curr++ = ',';

			if(!ctx.vsAsmStyle)
				*curr++ = ' ';

			bool usex64 = name >= o_mov64 || (argB.type == x86Argument::argPtr && sizeof(void*) == 8) || name == o_movsxd || (argA.type == x86Argument::argPtr && argA.ptrSize == sQWORD);
			bool useMmWord = ctx.vsAsmStyle && (argA.type == x86Argument::argXmmReg || name == o_cvttsd2si || name == o_cvttsd2si64);

			curr += argB.Decode(ctx, curr, bufSize, usex64, useMmWord, name == o_lea);
		}
	}

	if(ctx.vsAsmStyle)
	{
		*curr++ = ' ';
		*curr++ = ' ';
		*curr = 0;
	}

	assert(buf + bufSize <= curr);
	return int(curr - buf);
}